

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O0

int __thiscall
TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
::ClassId(TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
          *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  string *str;
  allocator<char> *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  TPZStructMatrixOR<std::complex<double>_> *in_stack_fffffffffffffec0;
  undefined1 local_29 [41];
  
  str = (string *)local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  uVar1 = Hash(str);
  iVar2 = TPZStructMatrixT<std::complex<double>_>::ClassId
                    ((TPZStructMatrixT<std::complex<double>_> *)in_stack_fffffffffffffec0);
  TPZFrontNonSym<std::complex<double>_>::TPZFrontNonSym
            ((TPZFrontNonSym<std::complex<double>_> *)CONCAT44(uVar1,iVar2));
  iVar3 = TPZFrontNonSym<std::complex<double>_>::ClassId
                    ((TPZFrontNonSym<std::complex<double>_> *)in_stack_fffffffffffffec0);
  iVar4 = TPZStructMatrixOR<std::complex<double>_>::ClassId(in_stack_fffffffffffffec0);
  TPZFrontNonSym<std::complex<double>_>::~TPZFrontNonSym
            ((TPZFrontNonSym<std::complex<double>_> *)0x1dc91eb);
  std::__cxx11::string::~string((string *)(local_29 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  return uVar1 ^ iVar2 * 2 ^ iVar3 << 2 ^ iVar4 << 3;
}

Assistant:

int TPZFrontStructMatrix<TFront,TVar,TPar>::ClassId() const{
    return Hash("TPZFrontStructMatrix") ^
        (TPZStructMatrixT<TVar>::ClassId()<< 1 ) ^
        TFront().ClassId() << 2 ^
        TPar::ClassId() << 3;
}